

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall
Lib::Array<unsigned_int>::Array(Array<unsigned_int> *this,initializer_list<unsigned_int> contents)

{
  uint *puVar1;
  ulong uVar2;
  long lVar3;
  
  Array(this,contents._M_len);
  puVar1 = this->_array;
  uVar2 = 0;
  for (lVar3 = contents._M_len << 2; lVar3 != 0; lVar3 = lVar3 + -4) {
    puVar1[uVar2 & 0xffffffff] = contents._M_array[uVar2];
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

inline
  Array (std::initializer_list<C> contents)
    : Array(contents.size()) 
  {
    auto iter = contents.begin();
    unsigned i = 0;
    while(iter != contents.end()) {
      ASS(i < _capacity)
      _array[i] = std::move(*iter);
      iter++;
      i++;
    }
  }